

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManage.cpp
# Opt level: O3

void init_memory_manager(void)

{
  MemoryNode *pMVar1;
  MemoryNode *pMVar2;
  MemoryNode *pMVar3;
  MemoryNode *pMVar4;
  MemoryNode *pMVar5;
  
  pMVar1 = (MemoryNode *)operator_new(0x20);
  code_used_memory_head = pMVar1;
  pMVar2 = (MemoryNode *)operator_new(0x20);
  data_used_memory_head = pMVar2;
  pMVar3 = (MemoryNode *)operator_new(0x20);
  code_free_memory_head = pMVar3;
  pMVar4 = (MemoryNode *)operator_new(0x20);
  data_free_memory_head = pMVar4;
  pMVar3->address = 0;
  pMVar3->size = 0;
  pMVar3->forward = (MemoryNode *)0x0;
  pMVar3->next = (MemoryNode *)0x0;
  pMVar3->mid = 0xff;
  pMVar4->address = 0;
  pMVar4->size = 0;
  pMVar4->forward = (MemoryNode *)0x0;
  pMVar4->next = (MemoryNode *)0x0;
  pMVar4->mid = 0xff;
  pMVar1->address = 0;
  pMVar1->size = 0;
  pMVar1->forward = (MemoryNode *)0x0;
  pMVar1->next = (MemoryNode *)0x0;
  pMVar1->mid = 0xff;
  pMVar2->address = 0;
  pMVar2->size = 0;
  pMVar2->forward = (MemoryNode *)0x0;
  pMVar2->next = (MemoryNode *)0x0;
  pMVar2->mid = 0xff;
  pMVar5 = (MemoryNode *)operator_new(0x20);
  pMVar5->address = 0;
  pMVar5->size = 0xffff;
  pMVar5->forward = pMVar4;
  pMVar5->next = (MemoryNode *)0x0;
  pMVar4->next = pMVar5;
  pMVar4 = (MemoryNode *)operator_new(0x20);
  pMVar4->address = 0;
  pMVar4->size = 0xffff;
  pMVar4->forward = pMVar3;
  pMVar4->next = (MemoryNode *)0x0;
  pMVar3->next = pMVar4;
  pMVar2->address = 0xffffffff;
  pMVar2->size = 0xffffffff;
  pMVar1->address = 0xffffffff;
  pMVar1->size = 0xffffffff;
  return;
}

Assistant:

void init_memory_manager() {
	code_used_memory_head = new MemoryNode;
	data_used_memory_head = new MemoryNode;
	code_free_memory_head = new MemoryNode;
	data_free_memory_head = new MemoryNode;
	clear_node(code_free_memory_head);
	clear_node(data_free_memory_head);
	clear_node(code_used_memory_head);
	clear_node(data_used_memory_head);

	/*创建空闲的数据段节点*/
	MemoryNode* first_free = new MemoryNode;
	first_free->address = 0;
	first_free->size = 0xffff;
	first_free->forward = data_free_memory_head;
	first_free->next = nullptr;
	data_free_memory_head->next = first_free;

	/*创建空闲的代码段段节点*/
	first_free = new MemoryNode;
	first_free->address = 0;
	first_free->size = 0xffff;
	first_free->forward = code_free_memory_head;
	first_free->next = nullptr;
	code_free_memory_head->next = first_free;

	data_used_memory_head->address = -1;
	data_used_memory_head->size = -1;
	code_used_memory_head->address = -1;
	code_used_memory_head->size = -1;
}